

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O2

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  int j;
  ulong uVar10;
  uint uVar11;
  Mat local_68;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 3) {
    uVar11 = bottom_top_blob->h * bottom_top_blob->w;
    uVar8 = 0;
    uVar7 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar7 = uVar8;
    }
    for (; (long)uVar8 < (long)this->channels; uVar8 = uVar8 + 1) {
      Mat::channel(&local_68,bottom_top_blob,(int)uVar8);
      pvVar9 = local_68.data;
      Mat::~Mat(&local_68);
      fVar1 = *(float *)((long)(this->a_data).data + uVar8 * 4);
      fVar2 = *(float *)((long)(this->b_data).data + uVar8 * 4);
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar9 + uVar6 * 4) = *(float *)((long)pvVar9 + uVar6 * 4) * fVar2 + fVar1;
      }
    }
  }
  else if (iVar3 == 2) {
    uVar11 = bottom_top_blob->w;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar11) {
      uVar8 = (ulong)uVar11;
    }
    pvVar9 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar6 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      fVar1 = *(float *)((long)pvVar4 + uVar7 * 4);
      fVar2 = *(float *)((long)pvVar5 + uVar7 * 4);
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        *(float *)((long)pvVar9 + uVar10 * 4) =
             *(float *)((long)pvVar9 + uVar10 * 4) * fVar2 + fVar1;
      }
      pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar11 * 4);
    }
  }
  else if (iVar3 == 1) {
    pvVar9 = bottom_top_blob->data;
    pvVar4 = (this->a_data).data;
    pvVar5 = (this->b_data).data;
    uVar8 = 0;
    uVar7 = (ulong)(uint)bottom_top_blob->w;
    if (bottom_top_blob->w < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *(float *)((long)pvVar9 + uVar8 * 4) =
           *(float *)((long)pvVar9 + uVar8 * 4) * *(float *)((long)pvVar5 + uVar8 * 4) +
           *(float *)((long)pvVar4 + uVar8 * 4);
    }
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j=0; j<w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i=0; i<size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}